

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

QByteArray * QTimeZonePrivate::ianaIdToWindowsId(QByteArray *__return_storage_ptr__,QByteArray *id)

{
  ushort uVar1;
  QBasicUtf8StringView<false> lhs;
  QLatin1StringView rhs;
  long lVar2;
  bool bVar3;
  long lVar4;
  long in_FS_OFFSET;
  iterator __begin2;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lhs.m_data = (id->d).ptr;
  lhs.m_size = (id->d).size;
  lVar4 = 0;
  do {
    local_58.m_haystack.m_data = "Asia/Kabul" + *(ushort *)((long)&DAT_00596274 + lVar4);
    local_58.m_haystack.m_size = -1;
    do {
      lVar2 = local_58.m_haystack.m_size + (ulong)*(ushort *)((long)&DAT_00596274 + lVar4) + 1;
      local_58.m_haystack.m_size = local_58.m_haystack.m_size + 1;
    } while ("Asia/Kabul"[lVar2] != '\0');
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_58.m_needle.ucs = L' ';
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)local_98,&local_58);
    if (local_98[0x18] == true) {
      do {
        rhs.m_data = (char *)local_98._16_8_;
        rhs.m_size = local_98._8_8_;
        bVar3 = QtPrivate::equalStrings(lhs,rhs);
        if (bVar3) {
          uVar1 = *(ushort *)((long)&QtTimeZoneCldr::zoneDataTable + lVar4);
          if (((ushort)(uVar1 - 1) < 0x8b) &&
             ((&QtTimeZoneCldr::windowsDataTable)[(ulong)(uVar1 - 1) * 6] == uVar1)) {
            lVar4 = -1;
            do {
              lVar2 = lVar4 + (ulong)(ushort)(&DAT_00596af2)[(ulong)(uVar1 - 1) * 6] + 1;
              lVar4 = lVar4 + 1;
            } while ("Afghanistan Standard Time"[lVar2] != '\0');
            QByteArray::QByteArray
                      (__return_storage_ptr__,
                       "Afghanistan Standard Time" + (ushort)(&DAT_00596af2)[(ulong)(uVar1 - 1) * 6]
                       ,lVar4);
          }
          else {
            ianaIdToWindowsId();
          }
          goto LAB_003f5ae1;
        }
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_98);
      } while (local_98[0x18] != false);
    }
    lVar4 = lVar4 + 6;
  } while (lVar4 != 0x876);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_003f5ae1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QTimeZonePrivate::ianaIdToWindowsId(const QByteArray &id)
{
    const auto idUtf8 = QUtf8StringView(id);

    for (const ZoneData &data : zoneDataTable) {
        for (auto l1 : data.ids()) {
            if (l1 == idUtf8)
                return toWindowsIdLiteral(data.windowsIdKey);
        }
    }
    // If the IANA ID is the default for any Windows ID, it has already shown up
    // as an ID for it in some territory; no need to search windowsDataTable[].
    return QByteArray();
}